

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

xpath_variable_set * __thiscall project::get_modules_abi_cxx11_(project *this)

{
  const_iterator pxVar1;
  const_iterator pxVar2;
  ostream *poVar3;
  char_t *in_RSI;
  xpath_variable_set *in_RDI;
  xpath_node node;
  const_iterator it;
  xpath_node_set modules;
  stringstream ss;
  xpath_node *in_stack_fffffffffffffda8;
  xpath_node_set *in_stack_fffffffffffffdb0;
  xml_node *in_stack_fffffffffffffdb8;
  xml_node *in_stack_fffffffffffffe08;
  xml_attribute local_1f0;
  xml_node_struct *local_1e8;
  xml_attribute_struct *pxStack_1e0;
  const_iterator local_1d8;
  xpath_node_set local_1c0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  pugi::xml_node::select_nodes(in_stack_fffffffffffffe08,in_RSI,in_RDI);
  local_1d8 = pugi::xpath_node_set::begin(&local_1c0);
  while( true ) {
    pxVar1 = local_1d8;
    pxVar2 = pugi::xpath_node_set::end(&local_1c0);
    if (pxVar1 == pxVar2) break;
    local_1e8 = (local_1d8->_node)._root;
    pxStack_1e0 = (local_1d8->_attribute)._attr;
    poVar3 = std::operator<<(local_188,"    JuceLibraryCode/include_");
    pugi::xpath_node::node(in_stack_fffffffffffffda8);
    local_1f0 = pugi::xml_node::attribute
                          (in_stack_fffffffffffffdb8,(char_t *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffdb8 = (xml_node *)pugi::xml_attribute::value(&local_1f0);
    in_stack_fffffffffffffdb0 =
         (xpath_node_set *)std::operator<<(poVar3,(char *)in_stack_fffffffffffffdb8);
    std::operator<<((ostream *)in_stack_fffffffffffffdb0,".cpp\n");
    local_1d8 = local_1d8 + 1;
  }
  std::__cxx11::stringstream::str();
  pugi::xpath_node_set::~xpath_node_set(in_stack_fffffffffffffdb0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string project::get_modules()
{
    std::stringstream ss;

    pugi::xpath_node_set modules = m_Doc.select_nodes("/JUCERPROJECT/MODULES/MODULE");
    for (pugi::xpath_node_set::const_iterator it = modules.begin(); it != modules.end(); ++it)
    {
        pugi::xpath_node node = *it;
        ss << "    JuceLibraryCode/include_" << node.node().attribute("id").value() << ".cpp\n";
    }

    return ss.str();
}